

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O0

int abuf_init(autobuf *autobuf)

{
  int iVar1;
  char *pcVar2;
  autobuf *autobuf_local;
  
  autobuf->_len = 0;
  iVar1 = getpagesize();
  pcVar2 = (char *)calloc(1,(long)iVar1);
  autobuf->_buf = pcVar2;
  if (autobuf->_buf == (char *)0x0) {
    autobuf->_error = true;
    autobuf_local._4_4_ = -1;
  }
  else {
    iVar1 = getpagesize();
    autobuf->_total = (long)iVar1;
    autobuf->_error = false;
    autobuf_local._4_4_ = 0;
  }
  return autobuf_local._4_4_;
}

Assistant:

int
abuf_init(struct autobuf *autobuf) {
  autobuf->_len = 0;
  autobuf->_buf = calloc(1, getpagesize());
  if (autobuf->_buf == NULL) {
    autobuf->_error = true;
    return -1;
  }
  autobuf->_total = getpagesize();
  autobuf->_error = false;
  return 0;
}